

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TiledRgbaInputFile::readTiles
          (TiledRgbaInputFile *this,int dxMin,int dxMax,int dyMin,int dyMax,int lx,int ly)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  bool bVar2;
  
  __mutex = (pthread_mutex_t *)this->_fromYa;
  if (__mutex == (pthread_mutex_t *)0x0) {
    TiledInputFile::readTiles(this->_inputFile,dxMin,dxMax,dyMin,dyMax,lx,ly);
    return;
  }
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    if (dyMin <= dyMax) {
      do {
        iVar1 = dxMin;
        if (dxMin <= dxMax) {
          do {
            FromYa::readTile(this->_fromYa,iVar1,dyMin,lx,ly);
            iVar1 = iVar1 + 1;
          } while (dxMax + 1 != iVar1);
        }
        bVar2 = dyMin != dyMax;
        dyMin = dyMin + 1;
      } while (bVar2);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void	
TiledRgbaInputFile::readTiles (int dxMin, int dxMax, int dyMin, int dyMax,
                               int lx, int ly)
{
    if (_fromYa)
    {
	Lock lock (*_fromYa);

        for (int dy = dyMin; dy <= dyMax; dy++)
            for (int dx = dxMin; dx <= dxMax; dx++)
	        _fromYa->readTile (dx, dy, lx, ly);
    }
    else
    {
        _inputFile->readTiles (dxMin, dxMax, dyMin, dyMax, lx, ly);
    }
}